

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::
priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
::fixDown(priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:30:11)>
          *this,size_t idx)

{
  bool bVar1;
  long lVar2;
  ulong local_68;
  size_t c;
  Song tmp;
  size_t idx_local;
  priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:30:11)>
  *this_local;
  
  tmp._64_8_ = idx;
  Song::Song((Song *)&c,this->mData + idx);
  while( true ) {
    lVar2 = tmp._64_8_ * 2;
    local_68 = lVar2 + 1;
    if (this->mSize <= local_68) break;
    if ((lVar2 + 2U < this->mSize) &&
       (bVar1 = anon_class_1_0_00000001_for_mLess::operator()
                          ((anon_class_1_0_00000001_for_mLess *)&this->field_0x18,
                           this->mData + local_68,this->mData + lVar2 + 2), bVar1)) {
      local_68 = lVar2 + 2;
    }
    bVar1 = anon_class_1_0_00000001_for_mLess::operator()
                      ((anon_class_1_0_00000001_for_mLess *)&this->field_0x18,this->mData + local_68
                       ,(Song *)&c);
    if (bVar1) break;
    Song::operator=(this->mData + tmp._64_8_,this->mData + local_68);
    tmp._64_8_ = local_68;
  }
  Song::operator=(this->mData + tmp._64_8_,(Song *)&c);
  Song::~Song((Song *)&c);
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }